

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dchChoice.c
# Opt level: O0

void Dch_CheckChoices(Aig_Man_t *p,int fSkipRedSupps)

{
  Aig_Obj_t **ppAVar1;
  bool bVar2;
  int iVar3;
  uint local_24;
  int fProb;
  int i;
  Aig_Obj_t *pObj;
  int fSkipRedSupps_local;
  Aig_Man_t *p_local;
  
  bVar2 = false;
  Aig_ManCleanMarkA(p);
  for (local_24 = 0; iVar3 = Vec_PtrSize(p->vObjs), (int)local_24 < iVar3; local_24 = local_24 + 1)
  {
    _fProb = (Aig_Obj_t *)Vec_PtrEntry(p->vObjs,local_24);
    if ((_fProb != (Aig_Obj_t *)0x0) && (iVar3 = Aig_ObjIsNode(_fProb), iVar3 != 0)) {
      if (p->pEquivs[(int)local_24] != (Aig_Obj_t *)0x0) {
        if (((uint)(*(ulong *)&_fProb->field_0x18 >> 4) & 1) == 1) {
          printf("node %d participates in more than one choice class\n",(ulong)local_24);
          bVar2 = true;
        }
        *(ulong *)&_fProb->field_0x18 = *(ulong *)&_fProb->field_0x18 & 0xffffffffffffffef | 0x10;
        if ((fSkipRedSupps != 0) &&
           (iVar3 = Dch_ObjCheckSuppRed(p,_fProb,p->pEquivs[(int)local_24]), iVar3 != 0)) {
          printf("node %d and repr %d have diff supports\n",(ulong)(uint)_fProb->Id,
                 (ulong)(uint)p->pEquivs[(int)local_24]->Id);
        }
        _fProb = p->pEquivs[(int)local_24];
        ppAVar1 = p->pEquivs;
        iVar3 = Aig_ObjId(_fProb);
        if (ppAVar1[iVar3] == (Aig_Obj_t *)0x0) {
          if (((uint)(*(ulong *)&_fProb->field_0x18 >> 4) & 1) == 1) {
            printf("repr %d has final node %d participates in more than one choice class\n",
                   (ulong)local_24,(ulong)(uint)_fProb->Id);
            bVar2 = true;
          }
          *(ulong *)&_fProb->field_0x18 = *(ulong *)&_fProb->field_0x18 & 0xffffffffffffffef | 0x10;
        }
        if ((*(ulong *)&_fProb->field_0x18 >> 6 & 0x3ffffff) != 0) {
          printf("node %d belonging to choice has fanout %d\n",(ulong)(uint)_fProb->Id,
                 (ulong)((uint)(*(ulong *)&_fProb->field_0x18 >> 6) & 0x3ffffff));
        }
      }
      if (((p->pReprs != (Aig_Obj_t **)0x0) && (p->pReprs[(int)local_24] != (Aig_Obj_t *)0x0)) &&
         ((*(ulong *)&_fProb->field_0x18 >> 6 & 0x3ffffff) != 0)) {
        printf("node %d has representative %d and fanout count %d\n",(ulong)(uint)_fProb->Id,
               (ulong)(uint)p->pReprs[(int)local_24]->Id,
               (ulong)((uint)(*(ulong *)&_fProb->field_0x18 >> 6) & 0x3ffffff));
        bVar2 = true;
      }
    }
  }
  Aig_ManCleanMarkA(p);
  if (bVar2) {
    printf("Verification of choice AIG FAILED.\n");
  }
  else {
    printf("Verification of choice AIG succeeded.\n");
  }
  return;
}

Assistant:

void Dch_CheckChoices( Aig_Man_t * p, int fSkipRedSupps )
{
    Aig_Obj_t * pObj;
    int i, fProb = 0;
    Aig_ManCleanMarkA( p );
    Aig_ManForEachNode( p, pObj, i )
    {
        if ( p->pEquivs[i] != NULL )
        {
            if ( pObj->fMarkA == 1 )
                printf( "node %d participates in more than one choice class\n", i ), fProb = 1;
            pObj->fMarkA = 1;
            // check redundancy
            if ( fSkipRedSupps && Dch_ObjCheckSuppRed( p, pObj, p->pEquivs[i]) )
                printf( "node %d and repr %d have diff supports\n", pObj->Id, p->pEquivs[i]->Id );
            // consider the next one
            pObj = p->pEquivs[i];
            if ( p->pEquivs[Aig_ObjId(pObj)] == NULL )
            {
                if ( pObj->fMarkA == 1 )
                    printf( "repr %d has final node %d participates in more than one choice class\n", i, pObj->Id ), fProb = 1;
                pObj->fMarkA = 1;
            }
            // consider the non-head ones
            if ( pObj->nRefs > 0 )
                printf( "node %d belonging to choice has fanout %d\n", pObj->Id, pObj->nRefs );
        }
        if ( p->pReprs && p->pReprs[i] != NULL )
        {
            if ( pObj->nRefs > 0 )
                printf( "node %d has representative %d and fanout count %d\n", pObj->Id, p->pReprs[i]->Id, pObj->nRefs ), fProb = 1;
        }
    }
    Aig_ManCleanMarkA( p );
    if ( !fProb )
        printf( "Verification of choice AIG succeeded.\n" );
    else
        printf( "Verification of choice AIG FAILED.\n" );
}